

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.hpp
# Opt level: O3

void __thiscall rudp::rudp_server::receive(rudp_server *this)

{
  static_vector<unsigned_char,_2048UL,_void> *__p;
  basic_endpoint<boost::asio::ip::udp> *__p_00;
  shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_> from;
  buffer_ptr_t data;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  static_vector<unsigned_char,_2048UL,_void> *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  anon_class_40_3_881517fd local_48;
  mutable_buffers_1 local_20;
  
  __p = (static_vector<unsigned_char,_2048UL,_void> *)operator_new(0x808);
  (__p->
  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ).m_holder.m_size = 0x800;
  memset(__p,0,0x800);
  local_58 = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<boost::container::static_vector<unsigned_char,2048ul,void>*>(&local_50,__p);
  __p_00 = (basic_endpoint<boost::asio::ip::udp> *)operator_new(0x1c);
  *(undefined8 *)((long)&(__p_00->impl_).data_ + 8) = 0;
  *(undefined8 *)((long)&(__p_00->impl_).data_ + 0x10) = 0;
  (__p_00->impl_).data_.v6.sin6_scope_id = 0;
  *(undefined8 *)&(__p_00->impl_).data_ = 2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>*>(&local_60,__p_00);
  local_20.super_mutable_buffer.size_ =
       (local_58->
       super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
       ).m_holder.m_size;
  local_20.super_mutable_buffer.data_ = local_58;
  local_48.data.
  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_58;
  local_48.data.
  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_50._M_pi;
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
    }
  }
  local_48.from.
  super___shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_60._M_pi;
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
    }
  }
  local_48.this = this;
  local_48.from.
  super___shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = __p_00;
  boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>::
  async_receive_from<boost::asio::mutable_buffers_1,rudp::rudp_server::receive()::_lambda(boost::system::error_code_const&,unsigned_long)_1_,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
            ((this->socket).
             super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             .impl_.service_,
             &(this->socket).
              super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              .impl_.implementation_,&local_20,__p_00,0,&local_48,
             &(this->socket).
              super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              .impl_.executor_);
  if (local_48.from.
      super___shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.from.
               super___shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_48.data.
      super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.data.
               super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
  }
  return;
}

Assistant:

void receive() {
    buffer_ptr_t data( new buffer_t( buffer_size ) );
    using boost::asio::ip::udp;
    std::shared_ptr< udp::endpoint > from( new udp::endpoint() );
    socket.async_receive_from(
      boost::asio::buffer( data->data(), data->size() ),
      *from,
      [this,data,from](
        const boost::system::error_code& error,
        size_t size
      ) {
        if( likely( !error ) ) {
          data->resize( size );
          receive();
	         auto &sess = sessions[ *from ];
	         if( !sess && is_syn( *data ) ) {
            sess.reset( new session( io_service, socket, *from, [this]( const boost::asio::ip::udp::endpoint &endpoint ) {
              auto s = sessions.find( endpoint );
              if( s != sessions.end() ) {
                session_bindings.erase( s->second->get_self_config().connection_identifier );
                sessions.erase( s );
              }
            } ) );
            session_bindings.insert( std::make_pair( sess->get_self_config().connection_identifier, *from ) );
          }
          if( sess ) {
            buffers_ptr_t received( new buffers_t() );
	           buffers_t response;
	           auto received_iter = std::back_inserter( *received );
            try {
	             sess->receive( data, received_iter );
	             if( !received->empty() )
                cb( *this, sess->get_self_config().connection_identifier, received );
              if( is_rst( *data ) ) {
                auto s = sessions.find( *from );
                if( s != sessions.end() ) {
                  session_bindings.erase( s->second->get_self_config().connection_identifier );
                  sessions.erase( s );
                }
              }
            } catch( const invalid_packet& ) {
              std::cout << "invalid packet" << std::endl;
            }
          }
        }
      }
    );
  }